

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh.c
# Opt level: O1

golf_bvh_node_info_t *
golf_bvh_node_info(golf_bvh_node_info_t *__return_storage_ptr__,golf_bvh_t *bvh,int idx,
                  golf_level_t *level,golf_entity_t *entity,float t)

{
  golf_bvh_aabb_t *aabb;
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  vec3 *pvVar7;
  vec3 *pvVar8;
  golf_bvh_face_t *pgVar9;
  golf_transform_t transform_00;
  mat4 m;
  mat4 m_00;
  mat4 m_01;
  mat4 m_02;
  golf_transform_t transform_01;
  _Bool _Var10;
  int iVar11;
  golf_model_t *pgVar12;
  golf_movement_t *pgVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  golf_model_group_t *pgVar17;
  char *pcVar18;
  byte bVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  vec3 vVar23;
  vec3 vVar24;
  vec3 vVar25;
  vec3 vVar26;
  mat4 model_mat;
  golf_transform_t transform;
  golf_model_group_t group;
  golf_material_t material;
  undefined4 uVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  undefined4 uVar30;
  undefined8 local_a38;
  undefined8 uStack_a30;
  undefined8 local_a28;
  undefined8 uStack_a20;
  undefined8 local_a18;
  undefined8 uStack_a10;
  undefined8 local_a08;
  undefined8 uStack_a00;
  golf_transform_t local_998;
  golf_transform_t local_968;
  char local_940 [48];
  undefined1 auVar31 [12];
  undefined1 in_stack_fffffffffffff6f0 [16];
  int in_stack_fffffffffffff700;
  int in_stack_fffffffffffff704;
  undefined8 in_stack_fffffffffffff708;
  undefined8 in_stack_fffffffffffff710;
  float local_8b4;
  float local_8b0;
  float local_8ac;
  golf_material_t local_490;
  
  bVar19 = 0;
  pgVar12 = golf_entity_get_model(entity);
  golf_entity_get_world_transform(&local_968,level,entity);
  pgVar13 = golf_entity_get_movement(entity);
  __return_storage_ptr__->idx = idx;
  __return_storage_ptr__->face_start = (bvh->faces).length;
  __return_storage_ptr__->face_count = (pgVar12->positions).length / 3;
  vVar23 = vec3_create(0.0,0.0,0.0);
  (__return_storage_ptr__->pos).x = (float)(int)vVar23._0_8_;
  (__return_storage_ptr__->pos).y = (float)(int)((ulong)vVar23._0_8_ >> 0x20);
  (__return_storage_ptr__->pos).z = vVar23.z;
  vVar23 = vec3_create(3.4028235e+38,3.4028235e+38,3.4028235e+38);
  (__return_storage_ptr__->aabb).min.x = (float)(int)vVar23._0_8_;
  (__return_storage_ptr__->aabb).min.y = (float)(int)((ulong)vVar23._0_8_ >> 0x20);
  (__return_storage_ptr__->aabb).min.z = vVar23.z;
  vVar23 = vec3_create(1.1754944e-38,1.1754944e-38,1.1754944e-38);
  (__return_storage_ptr__->aabb).max.x = (float)(int)vVar23._0_8_;
  (__return_storage_ptr__->aabb).max.y = (float)(int)((ulong)vVar23._0_8_ >> 0x20);
  (__return_storage_ptr__->aabb).max.z = vVar23.z;
  local_998.scale.y = local_968.scale.y;
  local_998.scale.z = local_968.scale.z;
  local_998.rotation.y = local_968.rotation.y;
  local_998.rotation.z = local_968.rotation.z;
  local_998.rotation.w = local_968.rotation.w;
  local_998.scale.x = local_968.scale.x;
  local_998.position.x = local_968.position.x;
  local_998.position.y = local_968.position.y;
  local_998.position.z = local_968.position.z;
  local_998.rotation.x = local_968.rotation.x;
  if (pgVar13 != (golf_movement_t *)0x0) {
    in_stack_fffffffffffff708 = *(undefined8 *)pgVar13;
    in_stack_fffffffffffff710 = *(undefined8 *)&pgVar13->t0;
    transform_00.position.z = local_968.position.z;
    transform_00.rotation.x = local_968.rotation.x;
    transform_00.position.x = local_968.position.x;
    transform_00.position.y = local_968.position.y;
    transform_00.rotation.y = local_968.rotation.y;
    transform_00.rotation.z = local_968.rotation.z;
    transform_00.rotation.w = local_968.rotation.w;
    transform_00.scale.x = local_968.scale.x;
    transform_00.scale.y = local_968.scale.y;
    transform_00.scale.z = local_968.scale.z;
    golf_transform_apply_movement(&local_998,transform_00,*pgVar13,t);
  }
  transform_01.rotation.y = (float)in_stack_fffffffffffff700;
  auVar31 = in_stack_fffffffffffff6f0._0_12_;
  transform_01.position.x = (float)auVar31._0_4_;
  transform_01.position.y = (float)auVar31._4_4_;
  transform_01.position.z = (float)auVar31._8_4_;
  transform_01.rotation.x = (float)in_stack_fffffffffffff6f0._12_4_;
  transform_01.rotation.z = (float)in_stack_fffffffffffff704;
  transform_01._24_8_ = in_stack_fffffffffffff708;
  transform_01.scale._4_8_ = in_stack_fffffffffffff710;
  golf_transform_get_model_mat(transform_01);
  if (0 < (pgVar12->groups).length) {
    aabb = &__return_storage_ptr__->aabb;
    lVar16 = 0;
    do {
      pgVar17 = (pgVar12->groups).data + lVar16;
      pcVar18 = local_940;
      for (lVar15 = 0x12; lVar15 != 0; lVar15 = lVar15 + -1) {
        *(undefined4 *)pcVar18 = *(undefined4 *)pgVar17->material_name;
        pgVar17 = (golf_model_group_t *)((long)pgVar17 + ((ulong)bVar19 * -2 + 1) * 4);
        pcVar18 = pcVar18 + (ulong)bVar19 * -8 + 4;
      }
      _Var10 = golf_level_get_material(level,local_940,(golf_material_t *)&stack0xfffffffffffff708);
      if (!_Var10) {
        golf_material_texture(&local_490,"",0.0,0.0,0.0,"data/textures/fallback.png");
        memcpy(&stack0xfffffffffffff708,&local_490,0x460);
      }
      if (0 < in_stack_fffffffffffff704) {
        lVar15 = 0;
        do {
          pvVar7 = (pgVar12->positions).data;
          lVar14 = (long)(in_stack_fffffffffffff700 + (int)lVar15);
          pvVar8 = pvVar7 + lVar14;
          uVar1 = pvVar8->x;
          uVar4 = pvVar8->y;
          vVar23.y = (float)uVar4;
          vVar23.x = (float)uVar1;
          uVar27 = (undefined4)local_a28;
          uVar28 = (undefined4)((ulong)local_a28 >> 0x20);
          uVar29 = (undefined4)uStack_a20;
          uVar30 = (undefined4)((ulong)uStack_a20 >> 0x20);
          m.m._8_8_ = uStack_a30;
          m.m._0_8_ = local_a38;
          m.m[4] = (float)uVar27;
          m.m[5] = (float)uVar28;
          m.m[6] = (float)uVar29;
          m.m[7] = (float)uVar30;
          m.m._32_8_ = local_a18;
          m.m._40_8_ = uStack_a10;
          m.m._48_8_ = local_a08;
          m.m._56_8_ = uStack_a00;
          vVar23.z = pvVar7[lVar14].z;
          vVar23 = vec3_apply_mat4(vVar23,1.0,m);
          pvVar7 = (pgVar12->positions).data;
          pvVar8 = pvVar7 + lVar14 + 1;
          uVar2 = pvVar8->x;
          uVar5 = pvVar8->y;
          vVar24.y = (float)uVar5;
          vVar24.x = (float)uVar2;
          m_00.m._8_8_ = uStack_a30;
          m_00.m._0_8_ = local_a38;
          m_00.m[4] = (float)uVar27;
          m_00.m[5] = (float)uVar28;
          m_00.m[6] = (float)uVar29;
          m_00.m[7] = (float)uVar30;
          m_00.m._32_8_ = local_a18;
          m_00.m._40_8_ = uStack_a10;
          m_00.m._48_8_ = local_a08;
          m_00.m._56_8_ = uStack_a00;
          vVar24.z = pvVar7[lVar14 + 1].z;
          vVar24 = vec3_apply_mat4(vVar24,1.0,m_00);
          pvVar7 = (pgVar12->positions).data;
          pvVar8 = pvVar7 + lVar14 + 2;
          uVar3 = pvVar8->x;
          uVar6 = pvVar8->y;
          vVar25.y = (float)uVar6;
          vVar25.x = (float)uVar3;
          m_01.m._8_8_ = uStack_a30;
          m_01.m._0_8_ = local_a38;
          m_01.m[4] = (float)uVar27;
          m_01.m[5] = (float)uVar28;
          m_01.m[6] = (float)uVar29;
          m_01.m[7] = (float)uVar30;
          m_01.m._32_8_ = local_a18;
          m_01.m._40_8_ = uStack_a10;
          m_01.m._48_8_ = local_a08;
          m_01.m._56_8_ = uStack_a00;
          vVar25.z = pvVar7[lVar14 + 2].z;
          vVar25 = vec3_apply_mat4(vVar25,1.0,m_01);
          vVar26 = vec3_add(__return_storage_ptr__->pos,vVar23);
          (__return_storage_ptr__->pos).x = (float)(int)vVar26._0_8_;
          (__return_storage_ptr__->pos).y = (float)(int)((ulong)vVar26._0_8_ >> 0x20);
          (__return_storage_ptr__->pos).z = vVar26.z;
          vVar26 = vec3_add(vVar26,vVar24);
          (__return_storage_ptr__->pos).x = (float)(int)vVar26._0_8_;
          (__return_storage_ptr__->pos).y = (float)(int)((ulong)vVar26._0_8_ >> 0x20);
          (__return_storage_ptr__->pos).z = vVar26.z;
          vVar26 = vec3_add(vVar26,vVar25);
          (__return_storage_ptr__->pos).x = (float)(int)vVar26._0_8_;
          (__return_storage_ptr__->pos).y = (float)(int)((ulong)vVar26._0_8_ >> 0x20);
          (__return_storage_ptr__->pos).z = vVar26.z;
          if (pgVar12->is_water == true) {
            pvVar8 = (pgVar12->water_dir).data;
            m_02.m._8_8_ = uStack_a30;
            m_02.m._0_8_ = local_a38;
            m_02.m[4] = (float)uVar27;
            m_02.m[5] = (float)uVar28;
            m_02.m[6] = (float)uVar29;
            m_02.m[7] = (float)uVar30;
            m_02.m._32_8_ = local_a18;
            m_02.m._40_8_ = uStack_a10;
            m_02.m._48_8_ = local_a08;
            m_02.m._56_8_ = uStack_a00;
            vVar26.z = (&pvVar8->z)[lVar15];
            vVar26._0_8_ = *(undefined8 *)(&pvVar8->x + lVar15);
            vVar26 = vec3_apply_mat4(vVar26,0.0,m_02);
            fVar22 = vVar26.z;
            fVar20 = vVar26.x;
            fVar21 = vVar26.y;
          }
          else {
            vVar26 = vec3_create(0.0,0.0,0.0);
            fVar22 = vVar26.z;
            fVar20 = vVar26.x;
            fVar21 = vVar26.y;
          }
          iVar11 = vec_expand_((char **)bvh,&(bvh->faces).length,&(bvh->faces).capacity,0x58,
                               (bvh->faces).alloc_category);
          if (iVar11 == 0) {
            pgVar9 = (bvh->faces).data;
            iVar11 = (bvh->faces).length;
            (bvh->faces).length = iVar11 + 1;
            pgVar9[iVar11].t = t;
            pgVar9[iVar11].level = level;
            pgVar9[iVar11].entity = entity;
            pgVar9[iVar11].a.x = (float)(int)vVar23._0_8_;
            pgVar9[iVar11].a.y = (float)(int)((ulong)vVar23._0_8_ >> 0x20);
            pgVar9[iVar11].a.z = vVar23.z;
            pgVar9[iVar11].b.x = (float)(int)vVar24._0_8_;
            pgVar9[iVar11].b.y = (float)(int)((ulong)vVar24._0_8_ >> 0x20);
            pgVar9[iVar11].b.z = vVar24.z;
            pgVar9[iVar11].c.x = (float)(int)vVar25._0_8_;
            pgVar9[iVar11].c.y = (float)(int)((ulong)vVar25._0_8_ >> 0x20);
            pgVar9[iVar11].c.z = vVar25.z;
            pgVar9[iVar11].water_dir.x = fVar20;
            pgVar9[iVar11].water_dir.y = fVar21;
            pgVar9[iVar11].water_dir.z = fVar22;
            pgVar9[iVar11].restitution = local_8b0;
            pgVar9[iVar11].friction = local_8b4;
            pgVar9[iVar11].vel_scale = local_8ac;
          }
          _update_aabb(aabb,vVar23);
          _update_aabb(aabb,vVar24);
          _update_aabb(aabb,vVar25);
          lVar15 = lVar15 + 3;
        } while ((int)lVar15 < in_stack_fffffffffffff704);
      }
      lVar16 = lVar16 + 1;
    } while (lVar16 < (pgVar12->groups).length);
  }
  vVar23 = vec3_scale(__return_storage_ptr__->pos,1.0 / (float)(pgVar12->positions).length);
  (__return_storage_ptr__->pos).x = (float)(int)vVar23._0_8_;
  (__return_storage_ptr__->pos).y = (float)(int)((ulong)vVar23._0_8_ >> 0x20);
  (__return_storage_ptr__->pos).z = vVar23.z;
  return __return_storage_ptr__;
}

Assistant:

golf_bvh_node_info_t golf_bvh_node_info(golf_bvh_t *bvh, int idx, golf_level_t *level, golf_entity_t *entity, float t) {
    golf_model_t *model = golf_entity_get_model(entity);
    golf_transform_t transform = golf_entity_get_world_transform(level, entity);
    golf_movement_t *movement = golf_entity_get_movement(entity);

    golf_bvh_node_info_t info;
    info.idx = idx;
    info.face_start = bvh->faces.length;
    info.face_count = model->positions.length / 3;
    info.pos = V3(0, 0, 0);
    info.aabb.min = V3(FLT_MAX, FLT_MAX, FLT_MAX);
    info.aabb.max = V3(FLT_MIN, FLT_MIN, FLT_MIN);

    golf_transform_t moved_transform = transform;
    if (movement) {
        moved_transform = golf_transform_apply_movement(moved_transform, *movement, t);
    }
    mat4 model_mat = golf_transform_get_model_mat(moved_transform);

    for (int i = 0; i < model->groups.length; i++) {
        golf_model_group_t group = model->groups.data[i];

        golf_material_t material;
        if (!golf_level_get_material(level, group.material_name, &material)) {
            material = golf_material_texture("", 0, 0, 0, "data/textures/fallback.png");
        }

        for (int j = 0; j < group.vertex_count; j += 3) {
            int v_idx = group.start_vertex + j;
            vec3 a = vec3_apply_mat4(model->positions.data[v_idx + 0], 1, model_mat);
            vec3 b = vec3_apply_mat4(model->positions.data[v_idx + 1], 1, model_mat);
            vec3 c = vec3_apply_mat4(model->positions.data[v_idx + 2], 1, model_mat);

            info.pos = vec3_add(info.pos, a);
            info.pos = vec3_add(info.pos, b);
            info.pos = vec3_add(info.pos, c);

            golf_bvh_face_t face;
            face.a = a;
            face.b = b;
            face.c = c;
            face.restitution = material.restitution;
            face.friction = material.friction;
            face.vel_scale = material.vel_scale;
            face.level = level;
            face.entity = entity;
            face.t = t;
            if (model->is_water) {
                face.water_dir = vec3_apply_mat4(model->water_dir.data[j / 3], 0, model_mat);
            }
            else {
                face.water_dir = V3(0, 0, 0);
            }
            vec_push(&bvh->faces, face);

            _update_aabb(&info.aabb, a);
            _update_aabb(&info.aabb, b);
            _update_aabb(&info.aabb, c);
        }
    }

    info.pos = vec3_scale(info.pos, 1.0f / model->positions.length);

    return info;
}